

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

int compute_num_enc_workers(AV1_COMP *cpi,int max_workers)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  AV1_COMMON *cm;
  int col;
  int row;
  TileInfo local_48;
  
  iVar4 = 1;
  if (1 < max_workers) {
    if ((cpi->oxcf).row_mt == true) {
      iVar4 = (cpi->common).tiles.rows;
      if (iVar4 < 1) {
        iVar5 = 0;
      }
      else {
        iVar1 = (cpi->common).tiles.cols;
        cm = &cpi->common;
        iVar5 = 0;
        row = 0;
        do {
          if (0 < iVar1) {
            col = 0;
            do {
              av1_tile_init(&local_48,cm,row,col);
              iVar2 = av1_get_sb_rows_in_tile(cm,&local_48);
              iVar3 = av1_get_sb_cols_in_tile(cm,&local_48);
              iVar3 = iVar3 + 1 >> 1;
              if (iVar2 <= iVar3) {
                iVar3 = iVar2;
              }
              iVar5 = iVar5 + iVar3;
              col = col + 1;
            } while (iVar1 != col);
          }
          row = row + 1;
        } while (row != iVar4);
      }
      if (iVar5 < max_workers) {
        max_workers = iVar5;
      }
      return max_workers;
    }
    iVar4 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
    if (max_workers <= iVar4) {
      iVar4 = max_workers;
    }
  }
  return iVar4;
}

Assistant:

static int compute_num_enc_workers(const AV1_COMP *cpi, int max_workers) {
  if (max_workers <= 1) return 1;
  if (cpi->oxcf.row_mt)
    return compute_num_enc_row_mt_workers(&cpi->common, max_workers);
  else
    return compute_num_enc_tile_mt_workers(&cpi->common, max_workers);
}